

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

Validator * __thiscall
CLI::Validator::operator|(Validator *__return_storage_ptr__,Validator *this,Validator *other)

{
  Validator *val2;
  byte local_e1;
  anon_class_64_2_fa08d804 local_b0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_70;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f1;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  Validator *local_20;
  Validator *other_local;
  Validator *this_local;
  Validator *newval;
  
  local_21 = 0;
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  Validator(__return_storage_ptr__);
  val2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48," OR ",&local_49);
  _merge_description(__return_storage_ptr__,this,val2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  f2 = &this->func_;
  local_70 = &local_20->func_;
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_b0.f1,f2);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_b0.f2,local_70);
  std::function<std::__cxx11::string(std::__cxx11::string&)>::operator|
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&__return_storage_ptr__->func_
             ,&local_b0);
  const::{lambda(std::__cxx11::string&)#1}::~basic_string
            ((_lambda_std____cxx11__string___1_ *)&local_b0);
  local_e1 = 0;
  if ((this->active_ & 1U) != 0) {
    local_e1 = local_20->active_;
  }
  __return_storage_ptr__->active_ = (bool)(local_e1 & 1);
  __return_storage_ptr__->application_index_ = this->application_index_;
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE Validator Validator::operator|(const Validator &other) const {
    Validator newval;

    newval._merge_description(*this, other, " OR ");

    // Give references (will make a copy in lambda function)
    const std::function<std::string(std::string &)> &f1 = func_;
    const std::function<std::string(std::string &)> &f2 = other.func_;

    newval.func_ = [f1, f2](std::string &input) {
        std::string s1 = f1(input);
        std::string s2 = f2(input);
        if(s1.empty() || s2.empty())
            return std::string();

        return std::string("(") + s1 + ") OR (" + s2 + ")";
    };
    newval.active_ = active_ && other.active_;
    newval.application_index_ = application_index_;
    return newval;
}